

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

uint __thiscall
ThreadContext::EnterScriptStart(ThreadContext *this,ScriptEntryExitRecord *record,bool doCleanup)

{
  uint uVar1;
  Recycler *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  
  this_00 = this->recycler;
  BVar4 = Memory::Recycler::IsReentrantState(this_00);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x57e,"(recycler->IsReentrantState())","recycler->IsReentrantState()");
    if (!bVar3) goto LAB_007101fd;
    *puVar6 = 0;
  }
  uVar1 = this->callRootLevel;
  this->callRootLevel = uVar1 + 1;
  if (uVar1 == 0) {
    if (this->hasThrownPendingException == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x586,"(!this->hasThrownPendingException)",
                         "!this->hasThrownPendingException");
      if (!bVar3) goto LAB_007101fd;
      *puVar6 = 0;
    }
    if (this->interruptPoller != (InterruptPoller *)0x0) {
      InterruptPoller::StartScript(this->interruptPoller);
    }
    Memory::Recycler::SetIsInScript(this_00,true);
    if (doCleanup) {
      Memory::Recycler::EnterIdleDecommit(this_00);
      Memory::Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(this_00);
      if (this->threadServiceWrapper == (ThreadServiceWrapper *)0x0) {
        Memory::Recycler::ScheduleNextCollection(this_00);
      }
    }
  }
  PushEntryExitRecord(this,record);
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x5a0,"(!this->IsScriptActive())",
                       "Missing EnterScriptEnd or LeaveScriptStart");
    if (!bVar3) {
LAB_007101fd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  this->isScriptActive = true;
  Memory::Recycler::SetIsScriptActive(this_00,true);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,RunPhase);
  if (bVar3) {
    DVar5 = GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> EnterScriptStart(%p): Level %d\n",(ulong)DVar5,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  return uVar1;
}

Assistant:

uint
ThreadContext::EnterScriptStart(Js::ScriptEntryExitRecord * record, bool doCleanup)
{
    Recycler * recycler = this->GetRecycler();
    Assert(recycler->IsReentrantState());
    JS_ETW_INTERNAL(EventWriteJSCRIPT_RUN_START(this,0));

    // Increment the callRootLevel early so that Dispose ran during FinishConcurrent will not close the current scriptContext
    uint oldCallRootLevel = this->callRootLevel++;

    if (oldCallRootLevel == 0)
    {
        Assert(!this->hasThrownPendingException);
        RECORD_TIMESTAMP(lastScriptStartTime);
        InterruptPoller *poller = this->interruptPoller;
        if (poller)
        {
            poller->StartScript();
        }

        recycler->SetIsInScript(true);
        if (doCleanup)
        {
            recycler->EnterIdleDecommit();
#if ENABLE_CONCURRENT_GC
            recycler->FinishConcurrent<FinishConcurrentOnEnterScript>();
#endif
            if (threadServiceWrapper == NULL)
            {
                // Reschedule the next collection at the start of the script.
                recycler->ScheduleNextCollection();
            }
        }
    }

    this->PushEntryExitRecord(record);

    AssertMsg(!this->IsScriptActive(),
              "Missing EnterScriptEnd or LeaveScriptStart");
    this->isScriptActive = true;
    recycler->SetIsScriptActive(true);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> EnterScriptStart(%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif

    return oldCallRootLevel;
}